

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.hpp
# Opt level: O3

walk_control __thiscall
kainjow::mustache::
basic_mustache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
render_component(basic_mustache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *this,render_handler *handler,
                context_internal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *ctx,component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *comp)

{
  tag_type tVar1;
  type tVar2;
  vector<kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pvVar3;
  long lVar4;
  bool bVar5;
  int iVar6;
  undefined4 extraout_var;
  basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *var;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  basic_mustache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  tmpl;
  string_type local_108;
  basic_mustache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e8;
  uint *puVar7;
  undefined4 extraout_var_00;
  
  tVar1 = (comp->tag).type;
  if (tVar1 == text) {
    bVar5 = component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::is_newline(comp);
    if (bVar5) {
      render_current_line(this,handler,ctx,comp);
      return walk;
    }
    std::__cxx11::string::_M_append((char *)&ctx->line_buffer,(ulong)(comp->text)._M_dataplus._M_p);
    return walk;
  }
  if (7 < tVar1 - variable) {
    return walk;
  }
  switch(tVar1) {
  default:
    iVar6 = (*ctx->ctx->_vptr_basic_context[4])();
    if ((basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)CONCAT44(extraout_var,iVar6) ==
        (basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)0x0) {
      return walk;
    }
    bVar5 = render_variable(this,handler,
                            (basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)CONCAT44(extraout_var,iVar6),ctx,(comp->tag).type == variable);
    break;
  case section_begin:
    iVar6 = (*ctx->ctx->_vptr_basic_context[4])();
    var = (basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)CONCAT44(extraout_var_00,iVar6);
    if (var == (basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)0x0) {
      return skip;
    }
    tVar2 = var->type_;
    if (tVar2 - lambda < 2) {
      bVar5 = render_lambda(this,handler,var,ctx,optional,
                            (comp->tag).section_text.
                            super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr,true);
      if (bVar5) {
        return skip;
      }
      return stop;
    }
    if (tVar2 == list) {
      pvVar3 = (var->list_)._M_t.
               super___uniq_ptr_impl<std::vector<kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::default_delete<std::vector<kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::vector<kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_*,_std::default_delete<std::vector<kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               .
               super__Head_base<0UL,_std::vector<kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_*,_false>
               ._M_head_impl;
      if (*(pointer *)
           &(pvVar3->
            super__Vector_base<kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            )._M_impl ==
          (pvVar3->
          super__Vector_base<kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish) {
        return skip;
      }
    }
    else if (tVar2 == bool_false) {
      return skip;
    }
    goto LAB_001de54f;
  case section_end:
  case comment:
    goto LAB_001de524;
  case section_begin_inverted:
    iVar6 = (*ctx->ctx->_vptr_basic_context[4])();
    var = (basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)CONCAT44(extraout_var_01,iVar6);
    if ((var != (basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x0) && (var->type_ != bool_false)) {
      if (var->type_ != list) {
        return skip;
      }
      pvVar3 = (var->list_)._M_t.
               super___uniq_ptr_impl<std::vector<kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::default_delete<std::vector<kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::vector<kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_*,_std::default_delete<std::vector<kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               .
               super__Head_base<0UL,_std::vector<kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_*,_false>
               ._M_head_impl;
      if (*(pointer *)
           &(pvVar3->
            super__Vector_base<kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            )._M_impl !=
          (pvVar3->
          super__Vector_base<kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish) {
        return skip;
      }
    }
LAB_001de54f:
    render_section(this,handler,ctx,comp,var);
    return skip;
  case partial:
    iVar6 = (*ctx->ctx->_vptr_basic_context[5])(ctx->ctx,&comp->tag);
    puVar7 = (uint *)CONCAT44(extraout_var_02,iVar6);
    if (puVar7 == (uint *)0x0) {
      return walk;
    }
    if ((*puVar7 | 4) != 5) {
      return walk;
    }
    if (*puVar7 == 5) {
      if (*(long *)(*(long *)(puVar7 + 8) + 0x10) == 0) {
        std::__throw_bad_function_call();
      }
      (**(code **)(*(long *)(puVar7 + 8) + 0x18))(&local_108);
    }
    else {
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      lVar4 = **(long **)(puVar7 + 4);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_108,lVar4,(*(long **)(puVar7 + 4))[1] + lVar4);
    }
    basic_mustache(&local_e8,&local_108);
    Catch::clara::std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::operator=(&local_e8.escape_,&this->escape_);
    if ((local_e8.error_message_._M_string_length == 0) &&
       (render(&local_e8,handler,ctx,false), local_e8.error_message_._M_string_length == 0)) {
      bVar5 = true;
    }
    else {
      std::__cxx11::string::_M_assign((string *)this);
      bVar5 = local_e8.error_message_._M_string_length == 0;
    }
    ~basic_mustache(&local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    break;
  case set_delimiter:
    std::__cxx11::string::_M_assign((string *)&ctx->delim_set);
    std::__cxx11::string::_M_assign((string *)&(ctx->delim_set).end);
    goto LAB_001de524;
  }
  if (!bVar5) {
    return stop;
  }
LAB_001de524:
  return walk;
}

Assistant:

typename component<string_type>::walk_control render_component(const render_handler& handler, context_internal<string_type>& ctx, component<string_type>& comp) {
        if (comp.is_text()) {
            if (comp.is_newline()) {
                render_current_line(handler, ctx, &comp);
            } else {
                render_result(ctx, comp.text);
            }
            return component<string_type>::walk_control::walk;
        }

        const mstch_tag<string_type>& tag{comp.tag};
        const basic_data<string_type>* var = nullptr;
        switch (tag.type) {
            case tag_type::variable:
            case tag_type::unescaped_variable:
                if ((var = ctx.ctx.get(tag.name)) != nullptr) {
                    if (!render_variable(handler, var, ctx, tag.type == tag_type::variable)) {
                        return component<string_type>::walk_control::stop;
                    }
                }
                break;
            case tag_type::section_begin:
                if ((var = ctx.ctx.get(tag.name)) != nullptr) {
                    if (var->is_lambda() || var->is_lambda2()) {
                        if (!render_lambda(handler, var, ctx, render_lambda_escape::optional, *comp.tag.section_text, true)) {
                            return component<string_type>::walk_control::stop;
                        }
                    } else if (!var->is_false() && !var->is_empty_list()) {
                        render_section(handler, ctx, comp, var);
                    }
                }
                return component<string_type>::walk_control::skip;
            case tag_type::section_begin_inverted:
                if ((var = ctx.ctx.get(tag.name)) == nullptr || var->is_false() || var->is_empty_list()) {
                    render_section(handler, ctx, comp, var);
                }
                return component<string_type>::walk_control::skip;
            case tag_type::partial:
                if ((var = ctx.ctx.get_partial(tag.name)) != nullptr && (var->is_partial() || var->is_string())) {
                    const auto& partial_result = var->is_partial() ? var->partial_value()() : var->string_value();
                    basic_mustache tmpl{partial_result};
                    tmpl.set_custom_escape(escape_);
                    if (!tmpl.is_valid()) {
                        error_message_ = tmpl.error_message();
                    } else {
                        tmpl.render(handler, ctx, false);
                        if (!tmpl.is_valid()) {
                            error_message_ = tmpl.error_message();
                        }
                    }
                    if (!tmpl.is_valid()) {
                        return component<string_type>::walk_control::stop;
                    }
                }
                break;
            case tag_type::set_delimiter:
                ctx.delim_set = *comp.tag.delim_set;
                break;
            default:
                break;
        }

        return component<string_type>::walk_control::walk;
    }